

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O3

void train_skill_over_time(int skill,int weight,int *counter,int fast,int slow,int light,int heavy)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 400;
  if (skill - 0x1eU < 7) {
    iVar2 = 0xb4;
  }
  if (slow - fast == 0) {
    iVar2 = slow / iVar2;
    iVar1 = *counter + 1;
  }
  else {
    iVar1 = (fast * heavy - light * slow) / ((slow - fast) * 10);
    iVar2 = (light / 10 + iVar1) * (slow / iVar2);
    iVar1 = weight / 10 + iVar1 + *counter;
  }
  *counter = iVar1;
  if (iVar2 <= iVar1) {
    use_skill(skill,iVar1 / iVar2);
    *counter = *counter % iVar2;
  }
  return;
}

Assistant:

void train_skill_over_time(int skill, int weight, int *counter,
			   int fast, int slow, int light, int heavy)
{
    const int divisor = 10; /* weight divisor, keeps factors low */
    int tick;
    int expert = practice_needed_to_advance(skill, P_EXPERT - 1);

    /*
     * Assumption: slow and fast are either always different or always the same,
     * so running the first branch below in one call and the second on the other
     * is a Bad Idea(tm) since the tick values for each branch are very different.
     */
    if (slow == fast) {
	/* fall back on fast and ignore weight */
	tick = fast / expert;
	*counter += 1;
    } else {
	/*
	 * We want the following equations to apply simultaneously:
	 *
	 *  tick = slow / expert * (light / divisor + offset)
	 *  tick = fast / expert * (heavy / divisor + offset)
	 *
	 * To get offset we equate the two:
	 *
	 *  s / e * (l / d + o) = f / e * (h / d + o)
	 *     sl / de + so / e = fh / de + fo / e
	 *               so / e = (fh - sl) / de + fo / e
	 *                   so = (fh - sl) / d + fo
	 *              so - fo = (fh - sl) / d
	 *             (s - f)o = (fh - sl) / d
	 *                    o = (fh - sl) / (d(s - f))
	 *
	 * The offset can then be substituted into either tick equation.
	 */
	int offset = (fast * heavy - slow * light) / (divisor * (slow - fast));
	tick = slow / expert * (light / divisor + offset);
	*counter += weight / divisor + offset;
    }

    /* Train once for every tick points accumulated in counter. */
    if (*counter >= tick) {
	use_skill(skill, *counter / tick);
	*counter %= tick;
    }
}